

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O1

size_t duckdb_zstd::HUF_readDTableX2_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize,
                 int flags)

{
  ulong uVar1;
  U32 *pUVar2;
  HUF_DTable *pHVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  HUF_DTable *pHVar17;
  U32 seq;
  U32 tableLog_00;
  uint uVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  uint *puVar23;
  U32 nbBits;
  size_t sVar24;
  U32 length;
  U32 *rankVal0;
  int local_c0;
  U32 nbSymbols;
  U32 tableLog;
  HUF_DTable *local_88;
  ulong local_80;
  ulong local_78;
  HUF_DTable *local_70;
  size_t local_68;
  ulong local_60;
  HUF_DTable *local_58;
  void *local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  sVar24 = 0xffffffffffffffff;
  if (0x84b < wkspSize) {
    uVar5 = *DTable;
    tableLog_00 = uVar5 & 0xff;
    *(undefined8 *)((long)workSpace + 0x2d0) = 0;
    *(undefined8 *)((long)workSpace + 0x2d8) = 0;
    *(undefined8 *)((long)workSpace + 0x2c0) = 0;
    *(undefined8 *)((long)workSpace + 0x2c8) = 0;
    *(undefined8 *)((long)workSpace + 0x2b0) = 0;
    *(undefined8 *)((long)workSpace + 0x2b8) = 0;
    *(undefined8 *)((long)workSpace + 0x2a0) = 0;
    *(undefined8 *)((long)workSpace + 0x2a8) = 0;
    *(undefined8 *)((long)workSpace + 0x290) = 0;
    *(undefined8 *)((long)workSpace + 0x298) = 0;
    *(undefined8 *)((long)workSpace + 0x280) = 0;
    *(undefined8 *)((long)workSpace + 0x288) = 0;
    *(undefined8 *)((long)workSpace + 0x270) = 0;
    *(undefined8 *)((long)workSpace + 0x278) = 0;
    sVar24 = 0xffffffffffffffd4;
    if (tableLog_00 < 0xd) {
      local_68 = HUF_readStats_wksp((BYTE *)((long)workSpace + 0x3e0),0x100,
                                    (U32 *)((long)workSpace + 0x270),&nbSymbols,&tableLog,src,
                                    srcSize,(void *)((long)workSpace + 0x4e0),0x36c,flags);
      sVar24 = local_68;
      if ((local_68 < 0xffffffffffffff89) &&
         (local_78 = (ulong)tableLog, sVar24 = 0xffffffffffffffd4, tableLog <= tableLog_00)) {
        local_70 = DTable + 1;
        iVar11 = tableLog + 1;
        uVar18 = 0;
        uVar14 = local_78;
        do {
          uVar18 = uVar18 + 1;
          pUVar2 = (U32 *)((long)workSpace + 0x270) + uVar14;
          uVar14 = (ulong)((int)uVar14 - 1);
        } while (*pUVar2 == 0);
        if (tableLog_00 == 0xc && tableLog < 0xc) {
          tableLog_00 = 0xb;
        }
        uVar8 = (tableLog - uVar18) + 2;
        iVar12 = 0;
        uVar14 = (ulong)uVar8;
        if (1 < uVar8) {
          lVar20 = 0;
          iVar9 = 0;
          do {
            iVar12 = *(int *)((long)workSpace + lVar20 * 4 + 0x274) + iVar9;
            *(int *)((long)workSpace + lVar20 * 4 + 0x2ac) = iVar9;
            lVar20 = lVar20 + 1;
            iVar9 = iVar12;
          } while (uVar14 - 1 != lVar20);
        }
        *(int *)((long)workSpace + 0x2a8) = iVar12;
        *(int *)((long)workSpace + uVar14 * 4 + 0x2a8) = iVar12;
        if ((ulong)nbSymbols != 0) {
          uVar16 = 0;
          do {
            uVar21 = (ulong)*(byte *)((long)workSpace + uVar16 + 0x3e0);
            uVar15 = *(uint *)((long)workSpace + uVar21 * 4 + 0x2a8);
            *(uint *)((long)workSpace + uVar21 * 4 + 0x2a8) = uVar15 + 1;
            *(char *)((long)workSpace + (ulong)uVar15 + 0x2e0) = (char)uVar16;
            uVar16 = uVar16 + 1;
          } while (nbSymbols != uVar16);
        }
        *(undefined4 *)((long)workSpace + 0x2a8) = 0;
        if (1 < uVar8) {
          lVar20 = 0;
          iVar12 = 0;
          do {
            lVar22 = lVar20 * 4;
            cVar7 = (char)lVar20;
            *(int *)((long)workSpace + lVar20 * 4 + 4) = iVar12;
            lVar20 = lVar20 + 1;
            iVar12 = (*(int *)((long)workSpace + lVar22 + 0x274) <<
                     (((char)tableLog_00 - (char)tableLog) + cVar7 & 0x1fU)) + iVar12;
          } while (uVar14 - 1 != lVar20);
        }
        uVar15 = (tableLog_00 - uVar18) + 1;
        if (uVar18 < uVar15) {
          uVar16 = (ulong)uVar18;
          lVar20 = uVar16 * 0x34;
          do {
            lVar22 = uVar14 - 1;
            puVar23 = (uint *)workSpace;
            if (1 < uVar8) {
              do {
                puVar23 = puVar23 + 1;
                *(uint *)((long)puVar23 + lVar20) = *puVar23 >> ((byte)uVar16 & 0x1f);
                lVar22 = lVar22 + -1;
              } while (lVar22 != 0);
            }
            uVar16 = uVar16 + 1;
            lVar20 = lVar20 + 0x34;
          } while (uVar15 != (uint)uVar16);
        }
        local_88 = DTable;
        if (0 < (int)(iVar11 - uVar18)) {
          local_60 = (ulong)(iVar11 - tableLog_00);
          local_58 = DTable + 7;
          local_c0 = tableLog * 2 + 1;
          iVar12 = local_c0 - tableLog_00;
          local_80 = 1;
          do {
            iVar9 = 1;
            if (1 < iVar12) {
              iVar9 = iVar12;
            }
            iVar13 = *(int *)((long)workSpace + local_80 * 4 + 0x2a4);
            lVar20 = (long)iVar13;
            iVar6 = *(int *)((long)workSpace + local_80 * 4 + 0x2a8);
            uVar8 = iVar11 - (int)local_80;
            if (tableLog_00 - uVar8 < uVar18) {
              HUF_fillDTableX2ForWeight
                        ((HUF_DEltX2 *)(local_70 + *(uint *)((long)workSpace + local_80 * 4)),
                         (sortedSymbol_t *)((long)workSpace + lVar20 + 0x2e0),
                         (sortedSymbol_t *)((long)workSpace + (long)iVar6 + 0x2e0),uVar8,tableLog_00
                         ,0,1);
            }
            else {
              iVar19 = 1 << ((byte)(tableLog_00 - uVar8) & 0x1f);
              if (iVar13 != iVar6) {
                lVar22 = local_78 * 0x34;
                uVar15 = (int)local_60 + uVar8;
                uVar16 = 1;
                if (1 < (int)uVar15) {
                  uVar16 = (ulong)uVar15;
                }
                iVar13 = *(int *)((long)workSpace + local_80 * 4);
                local_50 = (void *)((ulong)uVar8 * 0x34 + (long)workSpace);
                local_48 = (ulong)(uVar8 * 0x10000 + 0x1000000);
                local_40 = (long)iVar6;
                do {
                  pHVar3 = local_70 + iVar13;
                  bVar4 = *(byte *)((long)workSpace + lVar20 + 0x2e0);
                  if (1 < (int)uVar15) {
                    uVar8 = (uint)local_48 | (uint)bVar4;
                    uVar10 = CONCAT44(uVar8,uVar8);
                    pHVar17 = pHVar3;
                    if (iVar19 != 2) {
                      if (iVar19 != 4) {
                        uVar8 = *(uint *)((long)local_50 + uVar16 * 4);
                        if (0 < (int)uVar8) {
                          uVar21 = 0;
                          do {
                            *(undefined8 *)(local_58 + (long)iVar13 + (uVar21 - 6)) = uVar10;
                            *(undefined8 *)(local_58 + (long)iVar13 + (uVar21 - 4)) = uVar10;
                            *(undefined8 *)(local_58 + (long)iVar13 + (uVar21 - 2)) = uVar10;
                            *(undefined8 *)(local_58 + (long)iVar13 + uVar21) = uVar10;
                            uVar21 = uVar21 + 8;
                          } while (uVar21 < uVar8);
                        }
                        goto LAB_003b1707;
                      }
                      *(undefined8 *)pHVar3 = uVar10;
                      pHVar17 = pHVar3 + 2;
                    }
                    *(undefined8 *)pHVar17 = uVar10;
                  }
LAB_003b1707:
                  uVar21 = uVar16;
                  nbBits = local_c0 - iVar9;
                  local_38 = lVar20;
                  if ((int)uVar16 <= (int)(iVar11 - uVar18)) {
                    do {
                      uVar1 = uVar21 + 1;
                      HUF_fillDTableX2ForWeight
                                ((HUF_DEltX2 *)
                                 (pHVar3 + *(uint *)((long)workSpace + uVar21 * 4 + lVar22)),
                                 (sortedSymbol_t *)
                                 ((long)workSpace +
                                 (long)*(int *)((long)workSpace + uVar21 * 4 + 0x2a4) + 0x2e0),
                                 (sortedSymbol_t *)
                                 ((long)workSpace +
                                 (long)*(int *)((long)workSpace + uVar21 * 4 + 0x2a8) + 0x2e0),
                                 nbBits,tableLog_00,(ushort)bVar4,2);
                      uVar21 = uVar1;
                      nbBits = nbBits - 1;
                    } while (uVar14 != uVar1);
                  }
                  iVar13 = iVar13 + iVar19;
                  lVar20 = local_38 + 1;
                } while ((int)local_40 != (int)lVar20);
              }
            }
            local_80 = local_80 + 1;
            local_78 = (ulong)((int)local_78 - 1);
            local_c0 = local_c0 + -1;
            iVar12 = iVar12 + -1;
          } while (local_80 != uVar14);
        }
        *(char *)local_88 = (char)uVar5;
        *(undefined1 *)((long)local_88 + 1) = 1;
        *(char *)((long)local_88 + 2) = (char)tableLog_00;
        *(char *)((long)local_88 + 3) = (char)(uVar5 >> 0x18);
        sVar24 = local_68;
      }
    }
  }
  return sVar24;
}

Assistant:

size_t HUF_readDTableX2_wksp(HUF_DTable* DTable,
                       const void* src, size_t srcSize,
                             void* workSpace, size_t wkspSize, int flags)
{
    U32 tableLog, maxW, nbSymbols;
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    U32 maxTableLog = dtd.maxTableLog;
    size_t iSize;
    void* dtPtr = DTable+1;   /* force compiler to avoid strict-aliasing */
    HUF_DEltX2* const dt = (HUF_DEltX2*)dtPtr;
    U32 *rankStart;

    HUF_ReadDTableX2_Workspace* const wksp = (HUF_ReadDTableX2_Workspace*)workSpace;

    if (sizeof(*wksp) > wkspSize) return ERROR(GENERIC);

    rankStart = wksp->rankStart0 + 1;
    ZSTD_memset(wksp->rankStats, 0, sizeof(wksp->rankStats));
    ZSTD_memset(wksp->rankStart0, 0, sizeof(wksp->rankStart0));

    DEBUG_STATIC_ASSERT(sizeof(HUF_DEltX2) == sizeof(HUF_DTable));   /* if compiler fails here, assertion is wrong */
    if (maxTableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    /* ZSTD_memset(weightList, 0, sizeof(weightList)); */  /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats_wksp(wksp->weightList, HUF_SYMBOLVALUE_MAX + 1, wksp->rankStats, &nbSymbols, &tableLog, src, srcSize, wksp->calleeWksp, sizeof(wksp->calleeWksp), flags);
    if (HUF_isError(iSize)) return iSize;

    /* check result */
    if (tableLog > maxTableLog) return ERROR(tableLog_tooLarge);   /* DTable can't fit code depth */
    if (tableLog <= HUF_DECODER_FAST_TABLELOG && maxTableLog > HUF_DECODER_FAST_TABLELOG) maxTableLog = HUF_DECODER_FAST_TABLELOG;

    /* find maxWeight */
    for (maxW = tableLog; wksp->rankStats[maxW]==0; maxW--) {}  /* necessarily finds a solution before 0 */

    /* Get start index of each weight */
    {   U32 w, nextRankStart = 0;
        for (w=1; w<maxW+1; w++) {
            U32 curr = nextRankStart;
            nextRankStart += wksp->rankStats[w];
            rankStart[w] = curr;
        }
        rankStart[0] = nextRankStart;   /* put all 0w symbols at the end of sorted list*/
        rankStart[maxW+1] = nextRankStart;
    }

    /* sort symbols by weight */
    {   U32 s;
        for (s=0; s<nbSymbols; s++) {
            U32 const w = wksp->weightList[s];
            U32 const r = rankStart[w]++;
            wksp->sortedSymbol[r].symbol = (BYTE)s;
        }
        rankStart[0] = 0;   /* forget 0w symbols; this is beginning of weight(1) */
    }

    /* Build rankVal */
    {   U32* const rankVal0 = wksp->rankVal[0];
        {   int const rescale = (maxTableLog-tableLog) - 1;   /* tableLog <= maxTableLog */
            U32 nextRankVal = 0;
            U32 w;
            for (w=1; w<maxW+1; w++) {
                U32 curr = nextRankVal;
                nextRankVal += wksp->rankStats[w] << (w+rescale);
                rankVal0[w] = curr;
        }   }
        {   U32 const minBits = tableLog+1 - maxW;
            U32 consumed;
            for (consumed = minBits; consumed < maxTableLog - minBits + 1; consumed++) {
                U32* const rankValPtr = wksp->rankVal[consumed];
                U32 w;
                for (w = 1; w < maxW+1; w++) {
                    rankValPtr[w] = rankVal0[w] >> consumed;
    }   }   }   }

    HUF_fillDTableX2(dt, maxTableLog,
                   wksp->sortedSymbol,
                   wksp->rankStart0, wksp->rankVal, maxW,
                   tableLog+1);

    dtd.tableLog = (BYTE)maxTableLog;
    dtd.tableType = 1;
    ZSTD_memcpy(DTable, &dtd, sizeof(dtd));
    return iSize;
}